

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

void __thiscall leveldb::Status::Status(Status *this,Code code,Slice *msg,Slice *msg2)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  uint32_t size;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (code == kOk) {
    __assert_fail("code != kOk",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/util/status.cc"
                  ,0x16,"leveldb::Status::Status(Code, const Slice &, const Slice &)");
  }
  uVar8 = msg->size_;
  uVar1 = msg2->size_;
  iVar2 = (int)uVar1;
  iVar4 = iVar2 + 2;
  if (iVar2 == 0) {
    iVar4 = 0;
  }
  iVar3 = (int)uVar8;
  uVar7 = (ulong)(iVar4 + iVar3 + 5);
  size = iVar4 + iVar3;
  pcVar5 = (char *)operator_new__(uVar7);
  __memcpy_chk(pcVar5,&size,4,uVar7);
  pcVar5[4] = (char)code;
  uVar8 = uVar8 & 0xffffffff;
  lVar6 = 0;
  if ((uint)(iVar4 + iVar3) < 0xfffffffb) {
    lVar6 = uVar7 - 5;
  }
  __memcpy_chk(pcVar5 + 5,msg->data_,uVar8,lVar6);
  if (iVar2 != 0) {
    pcVar5[iVar3 + 5] = ':';
    pcVar5[iVar3 + 6] = ' ';
    lVar6 = 0;
    if (uVar8 + 7 <= uVar7) {
      lVar6 = uVar7 - (uVar8 + 7);
    }
    __memcpy_chk(pcVar5 + uVar8 + 7,msg2->data_,uVar1 & 0xffffffff,lVar6);
  }
  this->state_ = pcVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Status::Status(Code code, const Slice& msg, const Slice& msg2) {
  assert(code != kOk);
  const uint32_t len1 = static_cast<uint32_t>(msg.size());
  const uint32_t len2 = static_cast<uint32_t>(msg2.size());
  const uint32_t size = len1 + (len2 ? (2 + len2) : 0);
  char* result = new char[size + 5];
  memcpy(result, &size, sizeof(size));
  result[4] = static_cast<char>(code);
  memcpy(result + 5, msg.data(), len1);
  if (len2) {
    result[5 + len1] = ':';
    result[6 + len1] = ' ';
    memcpy(result + 7 + len1, msg2.data(), len2);
  }
  state_ = result;
}